

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::Parse(Cluster *this,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  long *plVar4;
  long lVar5;
  IMkvReader *local_c0;
  longlong stop;
  longlong size_1;
  longlong start;
  Block *pBlock;
  BlockEntry *pLast;
  long idx;
  Cluster *this_;
  longlong block_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong cluster_stop;
  long status;
  long *len_local;
  longlong *pos_local;
  Cluster *this_local;
  undefined4 extraout_var;
  
  status = (long)len;
  len_local = pos;
  pos_local = (longlong *)this;
  cluster_stop = Load(this,pos,len);
  this_local = (Cluster *)cluster_stop;
  if (-1 < cluster_stop) {
    if ((this->m_pos < this->m_element_start) || (this->m_timecode < 0)) {
      this_local = (Cluster *)0xffffffffffffffff;
    }
    else {
      if (this->m_element_size < 0) {
        local_c0 = (IMkvReader *)0xffffffffffffffff;
      }
      else {
        local_c0 = (IMkvReader *)(this->m_element_start + this->m_element_size);
      }
      pReader = local_c0;
      if (((long)local_c0 < 0) || (this->m_pos < (long)local_c0)) {
        total = (longlong)this->m_pSegment->m_pReader;
        iVar1 = (*((IMkvReader *)total)->_vptr_IMkvReader[1])(total,&avail,&result);
        cluster_stop = (longlong)iVar1;
        this_local = (Cluster *)cluster_stop;
        if (-1 < cluster_stop) {
          if ((avail < 0) || (result <= avail)) {
            *len_local = this->m_pos;
            do {
              do {
                if ((-1 < (long)pReader) && ((long)pReader <= *len_local)) {
LAB_001213ed:
                  if (this->m_element_size < 1) {
                    return -2;
                  }
                  this->m_pos = *len_local;
                  if ((-1 < (long)pReader) && ((long)pReader < this->m_pos)) {
                    return -2;
                  }
                  if (0 < this->m_entries_count) {
                    if (this->m_entries[this->m_entries_count + -1] == (BlockEntry *)0x0) {
                      return -1;
                    }
                    iVar1 = (*this->m_entries[this->m_entries_count + -1]->_vptr_BlockEntry[2])();
                    plVar4 = (long *)CONCAT44(extraout_var,iVar1);
                    if (plVar4 == (long *)0x0) {
                      return -1;
                    }
                    if ((-1 < avail) && (avail < *plVar4)) {
                      return -1;
                    }
                    lVar5 = *plVar4 + plVar4[1];
                    if ((-1 < (long)pReader) && ((long)pReader < lVar5)) {
                      return -2;
                    }
                    if ((-1 < avail) && (avail < lVar5)) {
                      return -1;
                    }
                  }
                  return 1;
                }
                if ((-1 < avail) && (avail <= *len_local)) {
                  if (this->m_element_size < 0) {
                    this->m_element_size = *len_local - this->m_element_start;
                  }
                  goto LAB_001213ed;
                }
                if (result < *len_local + 1) {
                  *(undefined8 *)status = 1;
                  return -3;
                }
                lVar2 = GetUIntLength((IMkvReader *)total,*len_local,(long *)status);
                if (lVar2 < 0) {
                  return lVar2;
                }
                if (0 < lVar2) {
                  return -3;
                }
                if ((-1 < (long)pReader) && ((long)pReader < *len_local + *(long *)status)) {
                  return -2;
                }
                if (result < *len_local + *(long *)status) {
                  return -3;
                }
                lVar2 = ReadID((IMkvReader *)total,*len_local,(long *)status);
                if (lVar2 < 0) {
                  return -2;
                }
                if ((lVar2 == 0x1f43b675) || (lVar2 == 0x1c53bb6b)) {
                  if (this->m_element_size < 0) {
                    this->m_element_size = *len_local - this->m_element_start;
                  }
                  goto LAB_001213ed;
                }
                *len_local = *(long *)status + *len_local;
                if (result < *len_local + 1) {
                  *(undefined8 *)status = 1;
                  return -3;
                }
                lVar3 = GetUIntLength((IMkvReader *)total,*len_local,(long *)status);
                if (lVar3 < 0) {
                  return lVar3;
                }
                if (0 < lVar3) {
                  return -3;
                }
                if ((-1 < (long)pReader) && ((long)pReader < *len_local + *(long *)status)) {
                  return -2;
                }
                if (result < *len_local + *(long *)status) {
                  return -3;
                }
                lVar3 = ReadUInt((IMkvReader *)total,*len_local,(long *)status);
                if (lVar3 < 0) {
                  return lVar3;
                }
                if (lVar3 == (1L << ((char)*(undefined8 *)status * '\a' & 0x3fU)) + -1) {
                  return -2;
                }
                *len_local = *(long *)status + *len_local;
                if ((-1 < (long)pReader) && ((long)pReader < *len_local)) {
                  return -2;
                }
              } while (lVar3 == 0);
              lVar5 = lVar3 + *len_local;
              if ((long)pReader < 0) {
                if ((-1 < avail) && (avail < lVar5)) {
                  this->m_element_size = avail - this->m_element_start;
                  *len_local = avail;
                  goto LAB_001213ed;
                }
                if (result < lVar5) {
                  *(longlong *)status = lVar3;
                  return -3;
                }
              }
              else if ((long)pReader < lVar5) {
                if ((lVar2 == 0xa0) || (lVar2 == 0xa3)) {
                  return -2;
                }
                *len_local = (long)pReader;
                goto LAB_001213ed;
              }
              if (lVar2 == 0xa0) {
                lVar5 = ParseBlockGroup(this,lVar3,len_local,(long *)status);
                return lVar5;
              }
              if (lVar2 == 0xa3) {
                lVar5 = ParseSimpleBlock(this,lVar3,len_local,(long *)status);
                return lVar5;
              }
              *len_local = lVar3 + *len_local;
            } while (((long)pReader < 0) || (*len_local <= (long)pReader));
            this_local = (Cluster *)0xfffffffffffffffe;
          }
          else {
            this_local = (Cluster *)0xfffffffffffffffe;
          }
        }
      }
      else {
        this_local = (Cluster *)0x1;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Cluster::Parse(long long& pos, long& len) const {
  long status = Load(pos, len);

  if (status < 0)
    return status;

  if (m_pos < m_element_start || m_timecode < 0)
    return E_PARSE_FAILED;

  const long long cluster_stop =
      (m_element_size < 0) ? -1 : m_element_start + m_element_size;

  if ((cluster_stop >= 0) && (m_pos >= cluster_stop))
    return 1;  // nothing else to do

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    if ((total >= 0) && (pos >= total)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if ((id == libwebm::kMkvCluster) || (id == libwebm::kMkvCues)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    // const long long block_start = pos;
    const long long block_stop = pos + size;

    if (cluster_stop >= 0) {
      if (block_stop > cluster_stop) {
        if (id == libwebm::kMkvBlockGroup || id == libwebm::kMkvSimpleBlock) {
          return E_FILE_FORMAT_INVALID;
        }

        pos = cluster_stop;
        break;
      }
    } else if ((total >= 0) && (block_stop > total)) {
      m_element_size = total - m_element_start;
      pos = total;
      break;
    } else if (block_stop > avail) {
      len = static_cast<long>(size);
      return E_BUFFER_NOT_FULL;
    }

    Cluster* const this_ = const_cast<Cluster*>(this);

    if (id == libwebm::kMkvBlockGroup)
      return this_->ParseBlockGroup(size, pos, len);

    if (id == libwebm::kMkvSimpleBlock)
      return this_->ParseSimpleBlock(size, pos, len);

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (m_element_size < 1)
    return E_FILE_FORMAT_INVALID;

  m_pos = pos;
  if (cluster_stop >= 0 && m_pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_entries_count > 0) {
    const long idx = m_entries_count - 1;

    const BlockEntry* const pLast = m_entries[idx];
    if (pLast == NULL)
      return E_PARSE_FAILED;

    const Block* const pBlock = pLast->GetBlock();
    if (pBlock == NULL)
      return E_PARSE_FAILED;

    const long long start = pBlock->m_start;

    if ((total >= 0) && (start > total))
      return E_PARSE_FAILED;  // defend against trucated stream

    const long long size = pBlock->m_size;

    const long long stop = start + size;
    if (cluster_stop >= 0 && stop > cluster_stop)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && (stop > total))
      return E_PARSE_FAILED;  // defend against trucated stream
  }

  return 1;  // no more entries
}